

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool __thiscall ON_wString::StartsWith(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *pwVar1;
  size_t sVar2;
  ON_Internal_Empty_wString *pOVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  sVar2 = wcslen(wszSub);
  if (sVar2 != 0) {
    pwVar1 = this->m_s;
    pOVar3 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar3 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    if (sVar2 <= (ulong)(long)(pOVar3->header).string_length) {
      lVar4 = 0;
      do {
        bVar5 = pwVar1[lVar4] == wszSub[lVar4];
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = sVar2 - 1 != lVar4;
        lVar4 = lVar4 + 1;
      } while (bVar6);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool ON_wString::StartsWith(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (m_s[i] != wszSub[i])
      return false;
  }

  return true;
}